

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLDateTime::parseDuration(XMLDateTime *this)

{
  XMLCh XVar1;
  bool bVar2;
  SchemaDateTimeException *this_00;
  XMLSize_t i;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  XMLSize_t XVar6;
  XMLCh *pXVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  double dVar13;
  
  pXVar7 = this->fBuffer;
  if ((pXVar7 == (XMLCh *)0x0) || (XVar1 = *pXVar7, XVar1 == L'\0')) {
    this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    pXVar7 = this->fBuffer;
    if (pXVar7 == (XMLCh *)0x0) {
      pXVar7 = L"";
    }
    SchemaDateTimeException::SchemaDateTimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x36e,DateTime_dur_invalid,pXVar7,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
    goto LAB_0024d8c3;
  }
  this->fStart = 1;
  if (XVar1 == L'-') {
    this->fStart = 2;
    uVar11 = 2;
    if (pXVar7[1] != L'P') {
      this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
      SchemaDateTimeException::SchemaDateTimeException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                 ,899,DateTime_dur_noP,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                 this->fMemoryManager);
      goto LAB_0024d8c3;
    }
  }
  else {
    uVar11 = 1;
    if (XVar1 != L'P') {
      this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
      SchemaDateTimeException::SchemaDateTimeException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                 ,0x379,DateTime_dur_Start_dashP,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0,this->fMemoryManager);
      goto LAB_0024d8c3;
    }
  }
  this->fValue[7] = (uint)(XVar1 == L'-') * 2 + 1;
  uVar9 = this->fEnd;
  uVar5 = uVar11;
  if (uVar11 < uVar9) {
    do {
      uVar3 = uVar11;
      if (pXVar7[uVar5] == L'-') {
        if ((int)uVar5 != -1) {
          this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
          SchemaDateTimeException::SchemaDateTimeException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                     ,0x397,DateTime_dur_DashNotFirst,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0,this->fMemoryManager);
          goto LAB_0024d8c3;
        }
        break;
      }
      uVar5 = uVar5 + 1;
    } while (uVar9 != uVar5);
    do {
      if (pXVar7[uVar3] == L'T') {
        if ((int)uVar3 != -1) {
          uVar9 = uVar3;
        }
        break;
      }
      uVar3 = uVar3 + 1;
    } while (uVar9 != uVar3);
  }
  uVar12 = -(uint)(XVar1 == L'-') | 1;
  uVar9 = (ulong)(int)uVar9;
  if (uVar11 < uVar9) {
    lVar4 = uVar11 * -0x100000000;
    uVar5 = uVar11;
    do {
      if (pXVar7[uVar5] == L'Y') {
        if ((int)uVar5 != -1) {
          iVar8 = parseInt(this,uVar11,-lVar4 >> 0x20);
          this->fValue[0] = iVar8 * uVar12;
          uVar11 = 0x100000000 - lVar4 >> 0x20;
          this->fStart = uVar11;
          bVar2 = true;
          goto LAB_0024d419;
        }
        break;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + -0x100000000;
    } while (uVar9 != uVar5);
  }
  bVar2 = false;
LAB_0024d419:
  if (uVar11 < uVar9) {
    lVar4 = uVar11 * -0x100000000;
    uVar5 = uVar11;
    do {
      if (this->fBuffer[uVar5] == L'M') {
        if ((int)uVar5 != -1) {
          iVar8 = parseInt(this,uVar11,-lVar4 >> 0x20);
          this->fValue[1] = iVar8 * uVar12;
          uVar11 = 0x100000000 - lVar4 >> 0x20;
          this->fStart = uVar11;
          bVar2 = true;
        }
        break;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + -0x100000000;
    } while (uVar9 != uVar5);
  }
  if (uVar11 < uVar9) {
    lVar4 = uVar11 * -0x100000000;
    uVar5 = uVar11;
    do {
      if (this->fBuffer[uVar5] == L'D') {
        if ((int)uVar5 != -1) {
          iVar8 = parseInt(this,uVar11,-lVar4 >> 0x20);
          this->fValue[2] = iVar8 * uVar12;
          uVar11 = 0x100000000 - lVar4 >> 0x20;
          this->fStart = uVar11;
          bVar2 = true;
        }
        break;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + -0x100000000;
    } while (uVar9 != uVar5);
  }
  uVar5 = this->fEnd;
  if ((uVar5 == uVar9) && (uVar11 != uVar5)) {
    this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    SchemaDateTimeException::SchemaDateTimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x3c5,DateTime_dur_inv_b4T,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
    goto LAB_0024d8c3;
  }
  if (uVar5 != uVar9) {
    uVar9 = uVar11 + 1;
    this->fStart = uVar9;
    if (uVar9 < uVar5) {
      lVar4 = uVar11 * -0x100000000;
      uVar11 = uVar9;
      do {
        if (this->fBuffer[uVar11] == L'H') {
          if ((int)uVar11 != -1) {
            iVar8 = parseInt(this,uVar9,0x100000000 - lVar4 >> 0x20);
            this->fValue[3] = iVar8 * uVar12;
            uVar9 = 0x200000000 - lVar4 >> 0x20;
            this->fStart = uVar9;
            uVar5 = this->fEnd;
            bVar2 = true;
          }
          break;
        }
        uVar11 = uVar11 + 1;
        lVar4 = lVar4 + -0x100000000;
      } while (uVar5 != uVar11);
    }
    if (uVar9 < uVar5) {
      lVar4 = uVar9 * -0x100000000;
      XVar6 = uVar9;
      do {
        if (this->fBuffer[XVar6] == L'M') {
          if ((int)XVar6 != -1) {
            iVar8 = parseInt(this,uVar9,-lVar4 >> 0x20);
            this->fValue[4] = iVar8 * uVar12;
            uVar9 = 0x100000000 - lVar4 >> 0x20;
            this->fStart = uVar9;
            uVar5 = this->fEnd;
            bVar2 = true;
          }
          break;
        }
        XVar6 = XVar6 + 1;
        lVar4 = lVar4 + -0x100000000;
      } while (uVar5 != XVar6);
    }
    if (uVar9 < uVar5) {
      lVar10 = uVar9 * -0x100000000;
      lVar4 = 0;
      do {
        if (this->fBuffer[uVar9 + lVar4] == L'S') {
          iVar8 = (int)uVar9 + (int)lVar4;
          if (iVar8 != -1) {
            uVar11 = -lVar10 >> 0x20;
            if (uVar11 <= uVar9) goto LAB_0024d6c9;
            uVar5 = lVar4 - 1;
            lVar4 = uVar9 << 0x20;
            XVar6 = uVar9;
            goto LAB_0024d669;
          }
          break;
        }
        lVar4 = lVar4 + 1;
        lVar10 = lVar10 + -0x100000000;
      } while ((uVar9 - uVar5) + lVar4 != 0);
    }
    goto LAB_0024d6ef;
  }
  goto LAB_0024d710;
  while( true ) {
    XVar6 = XVar6 + 1;
    lVar4 = lVar4 + 0x100000000;
    uVar5 = (ulong)((int)uVar5 - 1);
    if ((long)iVar8 == XVar6) break;
LAB_0024d669:
    if (this->fBuffer[XVar6] == L'.') {
      if ((int)XVar6 != -1) {
        if ((int)uVar5 == 0) {
          this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
          SchemaDateTimeException::SchemaDateTimeException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                     ,0x3f6,DateTime_dur_inv_seconds,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0,this->fMemoryManager);
          goto LAB_0024d8c3;
        }
        iVar8 = parseInt(this,uVar9,lVar4 >> 0x20);
        this->fValue[5] = iVar8 * uVar12;
        dVar13 = parseMiliSecond(this,(long)((int)XVar6 + 1),uVar11);
        this->fMilliSecond = dVar13 * (double)(int)uVar12;
        goto LAB_0024d6db;
      }
      break;
    }
  }
LAB_0024d6c9:
  iVar8 = parseInt(this,uVar9,uVar11);
  this->fValue[5] = iVar8 * uVar12;
LAB_0024d6db:
  uVar9 = 0x100000000 - lVar10 >> 0x20;
  this->fStart = uVar9;
  uVar5 = this->fEnd;
  bVar2 = true;
LAB_0024d6ef:
  if ((uVar9 != uVar5) || (this->fStart = uVar5 - 1, this->fBuffer[uVar5 - 1] == L'T')) {
    this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    SchemaDateTimeException::SchemaDateTimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x40d,DateTime_dur_NoTimeAfterT,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0
               ,this->fMemoryManager);
    goto LAB_0024d8c3;
  }
LAB_0024d710:
  if (bVar2) {
    return;
  }
  this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
  SchemaDateTimeException::SchemaDateTimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
             ,0x416,DateTime_dur_NoElementAtAll,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0
             ,this->fMemoryManager);
LAB_0024d8c3:
  __cxa_throw(this_00,&SchemaDateTimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLDateTime::parseDuration()
{
    if (!initParser())
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_invalid
                , fBuffer ? fBuffer : XMLUni::fgZeroLenString
                , fMemoryManager);

    // must start with '-' or 'P'
    //
    XMLCh c = fBuffer[fStart++];
    if ( (c != DURATION_STARTER) &&
         (c != chDash)            )
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_Start_dashP
                , fBuffer
                , fMemoryManager);
    }

    // 'P' must ALWAYS be present in either case
    if ( (c == chDash) &&
         (fBuffer[fStart++]!= DURATION_STARTER ))
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_noP
                , fBuffer
                , fMemoryManager);
    }

    // java code
    //date[utc]=(c=='-')?'-':0;
    //fValue[utc] = UTC_STD;
    fValue[utc] = (fBuffer[0] == chDash? UTC_NEG : UTC_STD);

    int negate = ( fBuffer[0] == chDash ? -1 : 1);

    //
    // No negative value is allowed after 'P'
    //
    // eg P-1234, invalid
    //
    if (indexOf(fStart, fEnd, chDash) != NOT_FOUND)
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_DashNotFirst
                , fBuffer
                , fMemoryManager);
    }

    //at least one number and designator must be seen after P
    bool designator = false;

    int endDate = indexOf(fStart, fEnd, DATETIME_SEPARATOR);
    if ( endDate == NOT_FOUND )
    {
        endDate = (int)fEnd;  // 'T' absent
    }

    //find 'Y'
    int end = indexOf(fStart, endDate, DURATION_Y);
    if ( end != NOT_FOUND )
    {
        //scan year
        fValue[CentYear] = negate * parseInt(fStart, end);
        fStart = end+1;
        designator = true;
    }

    end = indexOf(fStart, endDate, DURATION_M);
    if ( end != NOT_FOUND )
    {
        //scan month
        fValue[Month] = negate * parseInt(fStart, end);
        fStart = end+1;
        designator = true;
    }

    end = indexOf(fStart, endDate, DURATION_D);
    if ( end != NOT_FOUND )
    {
        //scan day
        fValue[Day] = negate * parseInt(fStart,end);
        fStart = end+1;
        designator = true;
    }

    if ( (fEnd == XMLSize_t (endDate)) &&   // 'T' absent
         (fStart != fEnd)   )   // something after Day
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_inv_b4T
                , fBuffer
                , fMemoryManager);
    }

    if ( fEnd != XMLSize_t (endDate) ) // 'T' present
    {
        //scan hours, minutes, seconds
        //

        // skip 'T' first
        end = indexOf(++fStart, fEnd, DURATION_H);
        if ( end != NOT_FOUND )
        {
            //scan hours
            fValue[Hour] = negate * parseInt(fStart, end);
            fStart = end+1;
            designator = true;
        }

        end = indexOf(fStart, fEnd, DURATION_M);
        if ( end != NOT_FOUND )
        {
            //scan min
            fValue[Minute] = negate * parseInt(fStart, end);
            fStart = end+1;
            designator = true;
        }

        end = indexOf(fStart, fEnd, DURATION_S);
        if ( end != NOT_FOUND )
        {
            //scan seconds
            int mlsec = indexOf (fStart, end, MILISECOND_SEPARATOR);

            /***
             * Schema Errata: E2-23
             * at least one digit must follow the decimal point if it appears.
             * That is, the value of the seconds component must conform
             * to the following pattern: [0-9]+(.[0-9]+)?
             */
            if ( mlsec != NOT_FOUND )
            {
                /***
                 * make usure there is something after the '.' and before the end.
                 */
                if ( mlsec+1 == end )
                {
                    ThrowXMLwithMemMgr1(SchemaDateTimeException
                            , XMLExcepts::DateTime_dur_inv_seconds
                            , fBuffer
                            , fMemoryManager);
                }

                fValue[Second]     = negate * parseInt(fStart, mlsec);
                fMilliSecond        = negate * parseMiliSecond(mlsec+1, end);
            }
            else
            {
                fValue[Second] = negate * parseInt(fStart,end);
            }

            fStart = end+1;
            designator = true;
        }

        // no additional data should appear after last item
        // P1Y1M1DT is illigal value as well
        if ( (fStart != fEnd) ||
              fBuffer[--fStart] == DATETIME_SEPARATOR )
        {
            ThrowXMLwithMemMgr1(SchemaDateTimeException
                    , XMLExcepts::DateTime_dur_NoTimeAfterT
                    , fBuffer
                    , fMemoryManager);
        }
    }

    if ( !designator )
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_NoElementAtAll
                , fBuffer
                , fMemoryManager);
    }

}